

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Parser::_resize_locations(Parser *this,size_t numnewlines)

{
  size_t *psVar1;
  
  if (this->m_newline_offsets_capacity < numnewlines) {
    if (this->m_newline_offsets != (size_t *)0x0) {
      (*(this->m_stack).m_callbacks.m_free)
                (this->m_newline_offsets,this->m_newline_offsets_capacity << 3,
                 (this->m_stack).m_callbacks.m_user_data);
      this->m_newline_offsets = (size_t *)0x0;
    }
    psVar1 = (size_t *)
             (*(this->m_stack).m_callbacks.m_allocate)
                       (numnewlines * 8,(void *)0x0,(this->m_stack).m_callbacks.m_user_data);
    this->m_newline_offsets = psVar1;
    this->m_newline_offsets_capacity = numnewlines;
  }
  return;
}

Assistant:

void Parser::_resize_locations(size_t numnewlines)
{
    if(numnewlines > m_newline_offsets_capacity)
    {
        if(m_newline_offsets)
            _RYML_CB_FREE(m_stack.m_callbacks, m_newline_offsets, size_t, m_newline_offsets_capacity);
        m_newline_offsets = _RYML_CB_ALLOC_HINT(m_stack.m_callbacks, size_t, numnewlines, m_newline_offsets);
        m_newline_offsets_capacity = numnewlines;
    }
}